

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O2

void gl_RecalcVertexHeights(vertex_t *v)

{
  float *pfVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  float fVar11;
  
  v->numheights = 0;
  uVar4 = 0;
  lVar8 = 0;
LAB_0038a2ef:
  if (v->numsectors <= lVar8) {
    if ((int)uVar4 < 3) {
      v->numheights = 0;
    }
    v->dirty = false;
    return;
  }
  iVar6 = 0;
  do {
    lVar7 = 0xd8;
    if (iVar6 != 0) {
      if (iVar6 == 2) break;
      lVar7 = 0xb0;
    }
    dVar10 = secplane_t::ZatPoint
                       ((secplane_t *)((long)&v->sectors[lVar8]->planes[0].xform.xOffs + lVar7),v);
    fVar11 = (float)dVar10;
    uVar2 = v->numheights;
    uVar4 = (ulong)(int)uVar2;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    __n = uVar4 << 2;
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      pfVar1 = v->heightlist;
      if (fVar11 == pfVar1[uVar9]) {
LAB_0038a392:
        uVar5 = uVar9 & 0xffffffff;
        break;
      }
      if (fVar11 < pfVar1[uVar9]) {
        memmove(pfVar1 + uVar9 + 1,pfVar1 + uVar9,__n);
        v->heightlist[uVar9] = fVar11;
        uVar2 = v->numheights + 1;
        uVar4 = (ulong)uVar2;
        v->numheights = uVar2;
        goto LAB_0038a392;
      }
      __n = __n - 4;
    }
    iVar3 = (int)uVar4;
    if ((int)uVar5 == iVar3) {
      uVar4 = (ulong)(iVar3 + 1U);
      v->numheights = iVar3 + 1U;
      v->heightlist[iVar3] = fVar11;
    }
    iVar6 = iVar6 + 1;
  } while( true );
  lVar8 = lVar8 + 1;
  goto LAB_0038a2ef;
}

Assistant:

void gl_RecalcVertexHeights(vertex_t * v)
{
	int i,j,k;
	float height;

	v->numheights=0;
	for(i=0;i<v->numsectors;i++)
	{
		for(j=0;j<2;j++)
		{
			if (j==0) height=v->sectors[i]->ceilingplane.ZatPoint(v);
			else height=v->sectors[i]->floorplane.ZatPoint(v);

			for(k=0;k<v->numheights;k++)
			{
				if (height == v->heightlist[k]) break;
				if (height < v->heightlist[k])
				{
					memmove(&v->heightlist[k+1], &v->heightlist[k], sizeof(float) * (v->numheights-k));
					v->heightlist[k]=height;
					v->numheights++;
					break;
				}
			}
			if (k==v->numheights) v->heightlist[v->numheights++]=height;
		}
	}
	if (v->numheights<=2) v->numheights=0;	// is not in need of any special attention
	v->dirty = false;
}